

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O2

bool __thiscall
lzham::search_accelerator::add_bytes_begin(search_accelerator *this,uint num_bytes,uint8 *pBytes)

{
  uchar *__src;
  bool bVar1;
  uint uVar2;
  
  uVar2 = this->m_max_dict_size_mask & this->m_lookahead_pos;
  memcpy((this->m_dict).m_p + uVar2,pBytes,(ulong)num_bytes);
  if (uVar2 < 0x101) {
    __src = (this->m_dict).m_p;
    memcpy(__src + this->m_max_dict_size,__src,0x101);
  }
  this->m_lookahead_size = num_bytes;
  uVar2 = this->m_max_dict_size - num_bytes;
  if (this->m_cur_dict_size < uVar2) {
    uVar2 = this->m_cur_dict_size;
  }
  this->m_cur_dict_size = uVar2;
  this->m_next_match_ref = 0;
  bVar1 = find_all_matches(this,num_bytes);
  return bVar1;
}

Assistant:

bool search_accelerator::add_bytes_begin(uint num_bytes, const uint8* pBytes)
   {
      LZHAM_ASSERT(num_bytes <= m_max_dict_size);
      LZHAM_ASSERT(!m_lookahead_size);

      uint add_pos = m_lookahead_pos & m_max_dict_size_mask;
      LZHAM_ASSERT((add_pos + num_bytes) <= m_max_dict_size);

      memcpy(&m_dict[add_pos], pBytes, num_bytes);

      if (add_pos < CLZBase::cMaxMatchLen)
         memcpy(&m_dict[m_max_dict_size], &m_dict[0], CLZBase::cMaxMatchLen);

      m_lookahead_size = num_bytes;

      uint max_possible_dict_size = m_max_dict_size - num_bytes;
      m_cur_dict_size = LZHAM_MIN(m_cur_dict_size, max_possible_dict_size);

      m_next_match_ref = 0;

      return find_all_matches(num_bytes);
   }